

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_split.cpp
# Opt level: O2

void midpt_split(ANNpointArray pa,ANNidxArray pidx,ANNorthRect *bnds,int n,int dim,int *cut_dim,
                ANNcoord *cut_val,int *n_lo)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  ANNcoord AVar6;
  double dVar7;
  double local_48;
  int br2;
  int br1;
  
  dVar7 = *bnds->hi - *bnds->lo;
  for (lVar3 = 1; lVar3 < dim; lVar3 = lVar3 + 1) {
    dVar5 = bnds->hi[lVar3] - bnds->lo[lVar3];
    if (dVar5 <= dVar7) {
      dVar5 = dVar7;
    }
    dVar7 = dVar5;
  }
  uVar4 = 0;
  uVar2 = (ulong)(uint)dim;
  if (dim < 1) {
    uVar2 = uVar4;
  }
  local_48 = -1.0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    if (dVar7 * 0.999 <= bnds->hi[uVar4] - bnds->lo[uVar4]) {
      AVar6 = annSpread(pa,pidx,n,(int)uVar4);
      if (local_48 < AVar6) {
        *cut_dim = (int)uVar4;
        local_48 = AVar6;
      }
    }
  }
  iVar1 = *cut_dim;
  dVar7 = (bnds->lo[iVar1] + bnds->hi[iVar1]) * 0.5;
  *cut_val = dVar7;
  annPlaneSplit(pa,pidx,n,iVar1,dVar7,&br1,&br2);
  iVar1 = n / 2;
  if (iVar1 <= br2) {
    br2 = iVar1;
  }
  if (iVar1 < br1) {
    br2 = br1;
  }
  *n_lo = br2;
  return;
}

Assistant:

void midpt_split(ANNpointArray pa,         // point array
                 ANNidxArray pidx,         // point indices (permuted on return)
                 const ANNorthRect &bnds,  // bounding rectangle for cell
                 int n,                    // number of points
                 int dim,                  // dimension of space
                 int &cut_dim,             // cutting dimension (returned)
                 ANNcoord &cut_val,        // cutting value (returned)
                 int &n_lo)  // num of points on low side (returned)
{
    int d;

    ANNcoord max_length = bnds.hi[0] - bnds.lo[0];
    for (d = 1; d < dim; d++) {  // find length of longest box side
        ANNcoord length = bnds.hi[d] - bnds.lo[d];
        if (length > max_length) {
            max_length = length;
        }
    }
    ANNcoord max_spread = -1;  // find long side with most spread
    for (d = 0; d < dim; d++) {
        // is it among longest?
        if (double(bnds.hi[d] - bnds.lo[d]) >= (1 - ERR) * max_length) {
            // compute its spread
            ANNcoord spr = annSpread(pa, pidx, n, d);
            if (spr > max_spread) {  // is it max so far?
                max_spread = spr;
                cut_dim = d;
            }
        }
    }
    // split along cut_dim at midpoint
    cut_val = (bnds.lo[cut_dim] + bnds.hi[cut_dim]) / 2;
    // permute points accordingly
    int br1, br2;
    annPlaneSplit(pa, pidx, n, cut_dim, cut_val, br1, br2);
    //------------------------------------------------------------------
    //	On return:	pa[0..br1-1] < cut_val
    //			pa[br1..br2-1] == cut_val
    //			pa[br2..n-1] > cut_val
    //
    //	We can set n_lo to any value in the range [br1..br2].
    //	We choose split so that points are most evenly divided.
    //------------------------------------------------------------------
    if (br1 > n / 2)
        n_lo = br1;
    else if (br2 < n / 2)
        n_lo = br2;
    else
        n_lo = n / 2;
}